

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O1

MPP_RET vdpp_control(VdppCtx ictx,VdppCmd cmd,void *iparam)

{
  uint uVar1;
  int iVar2;
  RK_S32 RVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  undefined8 uVar13;
  vdpp_reg *dst_reg;
  RegOffsetInfo reg_off [2];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  zme_reg *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  long local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  dmsr_reg *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  if ((ictx == (VdppCtx)0x0) || (cmd != VDPP_CMD_RUN_SYNC && iparam == (void *)0x0)) {
    _mpp_log_l(2,"vdpp","found NULL iparam %p cmd %d ctx %p\n","vdpp_control",iparam,cmd,ictx);
    return MPP_ERR_NULL_PTR;
  }
  if ((int)cmd < 0x100) {
    if (cmd == VDPP_CMD_SET_SRC) {
      if (iparam != (void *)0x0) {
        *(undefined4 *)((long)ictx + 0x24) = *iparam;
        *(undefined4 *)((long)ictx + 0x28) = *(undefined4 *)((long)iparam + 4);
        *(undefined4 *)((long)ictx + 0x2c) = *(undefined4 *)((long)iparam + 8);
        return MPP_OK;
      }
      lVar11 = (long)ictx + 0x24;
    }
    else {
      if (cmd != VDPP_CMD_SET_DST) {
        if (cmd != VDPP_CMD_SET_COM_CFG) {
          return MPP_OK;
        }
        goto LAB_00107786;
      }
      if (iparam != (void *)0x0) {
        *(undefined4 *)((long)ictx + 0x30) = *iparam;
        *(undefined4 *)((long)ictx + 0x34) = *(undefined4 *)((long)iparam + 4);
        *(undefined4 *)((long)ictx + 0x38) = *(undefined4 *)((long)iparam + 8);
        return MPP_OK;
      }
      lVar11 = (long)ictx + 0x30;
    }
    _mpp_log_l(2,"vdpp","found NULL vdpp_addr %p img %p\n","set_addr",lVar11);
    return MPP_OK;
  }
  if (1 < cmd - VDPP_CMD_SET_ZME_COM_CFG) {
    if (cmd == VDPP_CMD_RUN_SYNC) {
      RVar3 = check_cap((vdpp_params *)((long)ictx + 8));
      if (RVar3 != 0) {
        local_118 = 0;
        uStack_110 = 0;
        memset(&local_108,0,0xd8);
        *(undefined8 *)((long)ictx + 0x108) = 0;
        *(undefined8 *)((long)ictx + 0x110) = 0;
        *(undefined8 *)((long)ictx + 0x118) = 0;
        *(undefined8 *)((long)ictx + 0x120) = 0;
        *(undefined8 *)((long)ictx + 0x128) = 0;
        *(undefined8 *)((long)ictx + 0x130) = 0;
        *(undefined8 *)((long)ictx + 0x138) = 0;
        *(undefined8 *)((long)ictx + 0x140) = 0;
        *(undefined8 *)((long)ictx + 0x148) = 0;
        *(undefined8 *)((long)ictx + 0x150) = 0;
        *(undefined8 *)((long)ictx + 0x158) = 0;
        *(undefined8 *)((long)ictx + 0x160) = 0;
        *(undefined8 *)((long)ictx + 0x168) = 0;
        *(undefined8 *)((long)ictx + 0x170) = 0;
        *(undefined8 *)((long)ictx + 0x178) = 0;
        *(undefined8 *)((long)ictx + 0x180) = 0;
        *(undefined1 *)((long)ictx + 0x108) = 1;
        *(uint *)((long)ictx + 0x10c) =
             *(int *)((long)ictx + 0x3c) << 0x18 |
             (*(uint *)((long)ictx + 0x10) & 3) << 0xc |
             (*(uint *)((long)ictx + 0xc) & 3) << 8 |
             *(uint *)((long)ictx + 0x10c) & 0xfeffcccf | 3 | (*(uint *)((long)ictx + 8) & 3) << 4;
        *(byte *)((long)ictx + 0x110) = *(byte *)((long)ictx + 0x110) & 0xfc | 2;
        *(ushort *)((long)ictx + 0x118) = *(ushort *)((long)ictx + 0x118) | 0xfff;
        *(byte *)((long)ictx + 0x128) = *(byte *)((long)ictx + 0x128) | 0x73;
        uVar1 = *(uint *)((long)ictx + 0x14);
        uVar9 = 0x10 - (uVar1 & 0xf);
        if ((uVar1 & 0xf) == 0) {
          uVar9 = 0;
        }
        uVar4 = *(uint *)((long)ictx + 0x18) & 7;
        uVar12 = 8 - uVar4;
        if (uVar4 == 0) {
          uVar12 = 0;
        }
        uVar4 = *(uint *)((long)ictx + 0x1c);
        uVar5 = 0x10 - (uVar4 & 0xf);
        if ((uVar4 & 0xf) == 0) {
          uVar5 = 0;
        }
        *(short *)((long)ictx + 0x138) = (short)(uVar9 + uVar1 + 3 >> 2);
        *(short *)((long)ictx + 0x13c) = (short)(uVar5 + uVar4 + 3 >> 2);
        *(uint *)((long)ictx + 0x140) =
             (uVar12 & 7) << 0x1c |
             (uVar9 & 0xf) << 0xc | (uVar9 + uVar1) - 1 & 0x7ff |
             *(uint *)((long)ictx + 0x140) & 0x88000800 |
             (*(uint *)((long)ictx + 0x18) + uVar12) * 0x10000 + 0x7ff0000 & 0x7ff0000;
        uVar1 = *(uint *)((long)ictx + 0x144);
        uVar9 = (uVar5 & 0xf) << 0xc | (uVar5 + uVar4) - 1 & 0x7ff;
        *(uint *)((long)ictx + 0x144) = uVar9 | uVar1 & 0xffff0800;
        *(uint *)((long)ictx + 0x144) =
             uVar9 | uVar1 & 0xf8000800 |
             *(int *)((long)ictx + 0x20) * 0x10000 + 0x7ff0000U & 0x7ff0000;
        *(undefined4 *)((long)ictx + 0x158) = 0x88ffffff;
        *(undefined4 *)((long)ictx + 0x168) = *(undefined4 *)((long)ictx + 0x24);
        *(undefined4 *)((long)ictx + 0x16c) = *(undefined4 *)((long)ictx + 0x28);
        *(undefined4 *)((long)ictx + 0x170) = *(undefined4 *)((long)ictx + 0x30);
        *(undefined4 *)((long)ictx + 0x174) = *(undefined4 *)((long)ictx + 0x34);
        set_dmsr_to_vdpp_reg((dmsr_params *)((long)ictx + 0x3c),(dmsr_reg *)((long)ictx + 0x188));
        *(undefined8 *)((long)ictx + 0xe8) = *(undefined8 *)((long)ictx + 0x14);
        *(undefined8 *)((long)ictx + 0xf0) = *(undefined8 *)((long)ictx + 0x1c);
        *(undefined4 *)((long)ictx + 0xf8) = *(undefined4 *)((long)ictx + 0xc);
        set_zme_to_vdpp_reg((zme_params *)((long)ictx + 0xc0),(zme_reg *)((long)ictx + 0x1dc));
        local_108 = 0x100000200;
        uStack_100 = 0x200000000110;
        local_f0 = 0x100000200;
        uStack_e8 = 0x220000000110;
        local_e0 = (long)ictx + 0x2ec;
        local_d8 = 0x100000200;
        uStack_d0 = 0x240000000110;
        local_c8 = (long)ictx + 0x3fc;
        local_c0 = 0x100000200;
        uStack_b8 = 0x260000000110;
        local_b0 = (long)ictx + 0x50c;
        local_a8 = 0x100000200;
        uStack_a0 = 0x280000000048;
        local_98 = (long)ictx + 0x61c;
        local_90 = 0x100000200;
        uStack_88 = 0x8000000054;
        local_118 = CONCAT44(*(undefined4 *)((long)ictx + 0x2c),0x19);
        uStack_110 = CONCAT44(*(undefined4 *)((long)ictx + 0x38),0x1b);
        local_78 = 0x1100000202;
        uStack_70 = 0x10;
        local_60 = 0x100000200;
        uStack_58 = 0x70;
        local_48 = 0x201;
        uStack_44 = 3;
        uStack_40 = 0x70;
        uStack_3c = 0;
        local_f8 = (zme_reg *)((long)ictx + 0x1dc);
        local_80 = (dmsr_reg *)((long)ictx + 0x188);
        local_68 = &local_118;
        local_50 = (long)ictx + 0x108;
        local_38 = (long)ictx + 0x108;
        iVar6 = ioctl(*ictx,0x40047601,&local_108);
        if (iVar6 != 0) {
          piVar7 = __errno_location();
          iVar2 = *piVar7;
          pcVar8 = strerror(iVar2);
          _mpp_log_l(2,"vdpp","ioctl SET_REG failed ret %d errno %d %s\n","vdpp_start",iVar6,iVar2,
                     pcVar8);
          if (*piVar7 != 0) goto LAB_00107e21;
        }
        uStack_100 = 0;
        local_f8 = (zme_reg *)0x0;
        local_108 = 0x200000300;
        iVar6 = ioctl(*ictx,0x40047601);
        if (iVar6 != 0) {
          piVar7 = __errno_location();
          iVar2 = *piVar7;
          pcVar8 = strerror(iVar2);
          _mpp_log_l(2,"vdpp","ioctl POLL_HW_FINISH failed ret %d errno %d %s\n","vdpp_wait",iVar6,
                     iVar2,pcVar8);
        }
        if (((byte)vdpp_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp","ro_frm_done_sts=%d\n",0,*(byte *)((long)ictx + 0x130) & 1);
        }
        if (((byte)vdpp_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp","ro_osd_max_sts=%d\n",0,*(uint *)((long)ictx + 0x130) >> 1 & 1);
        }
        if (((byte)vdpp_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp","ro_bus_error_sts=%d\n",0,*(uint *)((long)ictx + 0x130) >> 4 & 1);
        }
        if (((byte)vdpp_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp","ro_timeout_sts=%d\n",0,*(uint *)((long)ictx + 0x130) >> 5 & 1);
        }
        if (((byte)vdpp_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp","ro_config_error_sts=%d\n",0,*(uint *)((long)ictx + 0x130) >> 5 & 1);
        }
        if (((*(byte *)((long)ictx + 0x128) & 1) == 0) || ((*(byte *)((long)ictx + 0x130) & 1) != 0)
           ) {
          if (((byte)vdpp_debug & 2) == 0) {
            return MPP_OK;
          }
          pcVar10 = "run vdpp success\n";
          uVar13 = 4;
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar10 = "run vdpp failed\n";
          pcVar8 = "vdpp_done";
          uVar13 = 2;
        }
        _mpp_log_l(uVar13,"vdpp",pcVar10,pcVar8);
        return MPP_OK;
      }
      _mpp_log_l(2,"vdpp","found incompat work mode %s cap %d\n","vdpp_start",working_mode_name[2],0
                );
LAB_00107e21:
      _mpp_log_l(2,"vdpp","run vdpp failed\n","vdpp_control");
      return MPP_NOK;
    }
    if (cmd != VDPP_CMD_SET_DMSR_CFG) {
      return MPP_OK;
    }
  }
LAB_00107786:
  switch(*iparam) {
  case 0:
    *(undefined4 *)((long)ictx + 8) = *(undefined4 *)((long)iparam + 8);
    *(undefined4 *)((long)ictx + 0xc) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0x10) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0x14) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0x18) = *(undefined4 *)((long)iparam + 0x18);
    *(undefined4 *)((long)ictx + 0x1c) = *(undefined4 *)((long)iparam + 0x1c);
    *(undefined4 *)((long)ictx + 0x20) = *(undefined4 *)((long)iparam + 0x20);
    break;
  case 1:
    memcpy((void *)((long)ictx + 0x3c),(void *)((long)iparam + 8),0x84);
    break;
  case 2:
    *(uint *)((long)ictx + 0xc0) = (uint)*(byte *)((long)iparam + 8);
    *(uint *)((long)ictx + 0xc4) = (uint)*(byte *)((long)iparam + 9);
    *(undefined4 *)((long)ictx + 200) = *(undefined4 *)((long)iparam + 0xc);
    *(undefined4 *)((long)ictx + 0xcc) = *(undefined4 *)((long)iparam + 0x10);
    *(undefined4 *)((long)ictx + 0xd0) = *(undefined4 *)((long)iparam + 0x14);
    *(undefined4 *)((long)ictx + 0xd4) = *(undefined4 *)((long)iparam + 0x18);
    break;
  case 3:
    if (*(long *)((long)iparam + 0x20) != 0) {
      *(long *)((long)ictx + 0xd8) = *(long *)((long)iparam + 0x20);
    }
    if (*(long *)((long)iparam + 0x28) != 0) {
      *(long *)((long)ictx + 0xe0) = *(long *)((long)iparam + 0x28);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpp_control(VdppCtx ictx, VdppCmd cmd, void *iparam)
{
    struct vdpp_api_ctx *ctx = ictx;
    MPP_RET ret = MPP_OK;

    if ((NULL == iparam && VDPP_CMD_RUN_SYNC != cmd) ||
        (NULL == ictx)) {
        mpp_err_f("found NULL iparam %p cmd %d ctx %p\n", iparam, cmd, ictx);
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd) {
    case VDPP_CMD_SET_COM_CFG:
    case VDPP_CMD_SET_DMSR_CFG:
    case VDPP_CMD_SET_ZME_COM_CFG:
    case VDPP_CMD_SET_ZME_COEFF_CFG: {
        struct vdpp_api_params *param = (struct vdpp_api_params *)iparam;

        ret = vdpp_set_param(ctx, &param->param, param->ptype);
        if (ret) {
            mpp_err_f("set vdpp parameter failed, type %d\n", param->ptype);
        }
        break;
    }
    case VDPP_CMD_SET_SRC:
        set_addr(&ctx->params.src, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST:
        set_addr(&ctx->params.dst, (VdppImg *)iparam);
        break;
    case VDPP_CMD_RUN_SYNC:
        ret = vdpp_start(ctx);
        if (ret) {
            mpp_err_f("run vdpp failed\n");
            return MPP_NOK;
        }

        vdpp_wait(ctx);
        vdpp_done(ctx);
        break;
    default:
        ;
    }

    return ret;
}